

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this,
          char_type *s,size_t length,semantic_tag tag)

{
  pointer this_00;
  ulong in_RDX;
  allocator_type *in_RDI;
  pointer ptr;
  semantic_tag *in_stack_ffffffffffffffa8;
  allocator<char> *args;
  uchar *in_stack_ffffffffffffffb0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffc0;
  allocator<char> local_29;
  pointer local_28;
  undefined1 local_1a;
  
  if (in_RDX < 0xe) {
    local_1a = (undefined1)in_RDX;
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    construct<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage,char_const*&,unsigned_char,jsoncons::semantic_tag&>
              (in_stack_ffffffffffffffc0,(char **)in_RDI,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8);
  }
  else {
    args = &local_29;
    std::allocator<char>::allocator();
    this_00 = create_long_string(in_stack_ffffffffffffffc0,in_RDI,
                                 (char_type *)in_stack_ffffffffffffffb0,(size_t)args);
    std::allocator<char>::~allocator(&local_29);
    local_28 = this_00;
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    construct<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage,jsoncons::utility::heap_string<char,jsoncons::null_type,std::allocator<char>>*&,jsoncons::semantic_tag&>
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this_00
               ,(heap_string<char,_jsoncons::null_type,_std::allocator<char>_> **)args,
               (semantic_tag *)0x277a04);
  }
  return;
}

Assistant:

basic_json(const char_type* s, std::size_t length, semantic_tag tag = semantic_tag::none)
        {
            if (length <= short_string_storage::max_length)
            {
                construct<short_string_storage>(s, static_cast<uint8_t>(length), tag);
            }
            else
            {
                auto ptr = create_long_string(allocator_type{}, s, length);
                construct<long_string_storage>(ptr, tag);
            }
        }